

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.h
# Opt level: O2

int __thiscall
Js::ConcatStringMulti::GetRandomAccessItemsFromConcatString
          (ConcatStringMulti *this,JavascriptString ***items)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = IsFilled(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ConcatString.h"
                                ,0x105,"(IsFilled())","IsFilled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *items = (JavascriptString **)(this + 1);
  return this->slotCount;
}

Assistant:

virtual int GetRandomAccessItemsFromConcatString(Js::JavascriptString * const *& items) const
        {
            Assert(IsFilled());
            items = AddressOf(m_slots[0]);
            return slotCount;
        }